

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O2

bool __thiscall
tinyusdz::ascii::AsciiParser::MaybeListEditQual(AsciiParser *this,ListEditQual *qual)

{
  ulong uVar1;
  bool bVar2;
  ListEditQual LVar3;
  string tok;
  
  bVar2 = SkipWhitespace(this);
  if (bVar2) {
    tok._M_dataplus._M_p = (pointer)&tok.field_2;
    tok._M_string_length = 0;
    tok.field_2._M_local_buf[0] = '\0';
    uVar1 = this->_sr->idx_;
    bVar2 = ReadIdentifier(this,&tok);
    if (bVar2) {
      bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&tok,"prepend");
      if (bVar2) {
        LVar3 = Prepend;
      }
      else {
        bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&tok,"append");
        if (bVar2) {
          LVar3 = Append;
        }
        else {
          bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&tok,"add");
          if (bVar2) {
            LVar3 = Add;
          }
          else {
            bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&tok,"delete");
            if (bVar2) {
              LVar3 = Delete;
            }
            else {
              bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&tok,"order");
              if (bVar2) {
                LVar3 = Order;
              }
              else {
                LVar3 = ResetToExplicit;
                if (uVar1 <= this->_sr->length_) {
                  this->_sr->idx_ = uVar1;
                }
              }
            }
          }
        }
      }
      *qual = LVar3;
      bVar2 = SkipWhitespace(this);
    }
    else {
      if (uVar1 <= this->_sr->length_) {
        this->_sr->idx_ = uVar1;
      }
      bVar2 = false;
    }
    ::std::__cxx11::string::_M_dispose();
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool AsciiParser::MaybeListEditQual(tinyusdz::ListEditQual *qual) {
  if (!SkipWhitespace()) {
    return false;
  }

  std::string tok;

  auto loc = CurrLoc();
  if (!ReadIdentifier(&tok)) {
    SeekTo(loc);
    return false;
  }

  if (tok == "prepend") {
    DCOUT("`prepend` list edit qualifier.");
    (*qual) = tinyusdz::ListEditQual::Prepend;
  } else if (tok == "append") {
    DCOUT("`append` list edit qualifier.");
    (*qual) = tinyusdz::ListEditQual::Append;
  } else if (tok == "add") {
    DCOUT("`add` list edit qualifier.");
    (*qual) = tinyusdz::ListEditQual::Add;
  } else if (tok == "delete") {
    DCOUT("`delete` list edit qualifier.");
    (*qual) = tinyusdz::ListEditQual::Delete;
  } else if (tok == "order") {
    DCOUT("`order` list edit qualifier.");
    (*qual) = tinyusdz::ListEditQual::Order;
  } else {
    DCOUT("No ListEdit qualifier.");
    // unqualified
    // rewind
    SeekTo(loc);
    (*qual) = tinyusdz::ListEditQual::ResetToExplicit;
  }

  if (!SkipWhitespace()) {
    return false;
  }

  return true;
}